

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkGetAigNodeNum(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  if ((pNtk->ntkFunc == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pVVar3 = pNtk->vObjs;
    if (pVVar3->nSize < 1) {
      iVar4 = 0;
    }
    else {
      lVar5 = 0;
      iVar4 = 0;
      do {
        pvVar1 = pVVar3->pArray[lVar5];
        if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
          if (*(Hop_Obj_t **)((long)pvVar1 + 0x38) == (Hop_Obj_t *)0x0) {
            __assert_fail("pNode->pData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                          ,0x119,"int Abc_NtkGetAigNodeNum(Abc_Ntk_t *)");
          }
          if (1 < *(int *)((long)pvVar1 + 0x1c)) {
            iVar2 = Hop_DagSize(*(Hop_Obj_t **)((long)pvVar1 + 0x38));
            iVar4 = iVar4 + iVar2;
          }
        }
        lVar5 = lVar5 + 1;
        pVVar3 = pNtk->vObjs;
      } while (lVar5 < pVVar3->nSize);
    }
    return iVar4;
  }
  __assert_fail("Abc_NtkIsAigLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                ,0x116,"int Abc_NtkGetAigNodeNum(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkGetAigNodeNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nNodes = 0;
    assert( Abc_NtkIsAigLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        if ( Abc_ObjFaninNum(pNode) < 2 )
            continue;
//printf( "%d ", Hop_DagSize( pNode->pData ) );
        nNodes += pNode->pData? Hop_DagSize( (Hop_Obj_t *)pNode->pData ) : 0;
    }
    return nNodes;
}